

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfHeader.c
# Opt level: O2

_Bool checkHeader(uint64_t *header,uint64_t *file_size,SkeinSize_t state_size)

{
  _Bool _Var1;
  ulong uVar2;
  
  if (file_size != (uint64_t *)0x0 && header != (uint64_t *)0x0) {
    _Var1 = validSize((ulong)state_size);
    if (((_Var1) && (uVar2 = (ulong)(state_size >> 6), header[uVar2] == 0x909202009092009)) &&
       (header[uVar2 + 2] == (ulong)state_size)) {
      *file_size = header[uVar2 + 1];
      _Var1 = true;
    }
    else {
      _Var1 = false;
    }
    return _Var1;
  }
  return false;
}

Assistant:

bool checkHeader(const uint64_t* header,
                 uint64_t* file_size,
                 const SkeinSize_t state_size)
{
    pdebug("checkHeader()\n");
    const uint32_t iv_offset = ((uint32_t)state_size/64);
    
    if(header != NULL && file_size != NULL && validSize(state_size))
    {
        pdebug("Header{ ");
        pdebug("%lu, ", header[iv_offset+0]);
        pdebug("%lu, ", header[iv_offset+1]);
        pdebug("%lu, ", header[iv_offset+2]);
        pdebug("%lu ", header[iv_offset+3]);
        pdebug("}\n");

        if(header[iv_offset+0] == MAGIC_NUMBER && 
           header[iv_offset+2] == state_size)//if the header check passes
        {
            *file_size = header[iv_offset+1]; //store the unpadded file size
            pdebug("Header check passed, header is valid\n");
            return true;
        }
    }
    return false;
}